

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O1

void Armor_off_sub(boolean already_dead)

{
  if ((uarm->otyp == 0x69) || (uarm->otyp == 0x5e)) {
    u.uprops[1].extrinsic._0_1_ = (byte)u.uprops[1].extrinsic & 0xfe;
    u.uprops[2].extrinsic._0_1_ = (byte)u.uprops[2].extrinsic & 0xfe;
    u.uprops[3].extrinsic._0_1_ = (byte)u.uprops[3].extrinsic & 0xfe;
    u.uprops[4].extrinsic._0_1_ = (byte)u.uprops[4].extrinsic & 0xfe;
    u.uprops[5].extrinsic._0_1_ = (byte)u.uprops[5].extrinsic & 0xfe;
    u.uprops[6].extrinsic._0_1_ = (byte)u.uprops[6].extrinsic & 0xfe;
    u.uprops[7].extrinsic._0_1_ = (byte)u.uprops[7].extrinsic & 0xfe;
    u.uprops[8].extrinsic._0_1_ = (byte)u.uprops[8].extrinsic & 0xfe;
    u.uprops[0x2a].extrinsic._0_1_ = (byte)u.uprops[0x2a].extrinsic & 0xfe;
  }
  if ((already_dead == '\0') && (uarmg == (obj *)0x0)) {
    selftouch("No longer petrify-resistant, you");
    return;
  }
  return;
}

Assistant:

static void Armor_off_sub(boolean already_dead)
{
    switch (uarm->otyp) {
	case CHROMATIC_DRAGON_SCALES:
	case CHROMATIC_DRAGON_SCALE_MAIL:
	    EFire_resistance	&= ~W_ARM;
	    ECold_resistance	&= ~W_ARM;
	    ESleep_resistance	&= ~W_ARM;
	    EDisint_resistance	&= ~W_ARM;
	    EShock_resistance	&= ~W_ARM;
	    EPoison_resistance	&= ~W_ARM;
	    EAcid_resistance	&= ~W_ARM;
	    EStone_resistance	&= ~W_ARM;
	    EReflecting		&= ~W_ARM;
	    break;
	default:
	    break;
    }

    if (!already_dead && !uarmg)
	selftouch("No longer petrify-resistant, you");
}